

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Hop_Obj_t *
Abc_NodeIfToHop_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  void **ppvVar6;
  
  pHVar4 = *(Hop_Obj_t **)&pIfObj->CutBest;
  if (pHVar4 == (Hop_Obj_t *)0x0) {
    pHVar4 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin0,vVisited);
    pHVar5 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin1,vVisited);
    pHVar4 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 4 & 1) ^ (ulong)pHVar4),
                     (Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 5 & 1) ^ (ulong)pHVar5));
    lVar3._0_4_ = (pIfObj->CutBest).Area;
    lVar3._4_4_ = (pIfObj->CutBest).Edge;
    if (lVar3 != 0) {
      __assert_fail("If_CutData(pCut) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                    ,0x232,
                    "Hop_Obj_t *Abc_NodeIfToHop_rec(Hop_Man_t *, If_Man_t *, If_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    *(Hop_Obj_t **)&pIfObj->CutBest = pHVar4;
    uVar1 = vVisited->nSize;
    if (uVar1 == vVisited->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar6;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar6;
        vVisited->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = vVisited->pArray;
    }
    iVar2 = vVisited->nSize;
    vVisited->nSize = iVar2 + 1;
    ppvVar6[iVar2] = &pIfObj->CutBest;
  }
  return pHVar4;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    gFunc0 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin0, vVisited );
    gFunc1 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin1, vVisited );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, pIfObj->fCompl0), Hop_NotCond(gFunc1, pIfObj->fCompl1) );  
    assert( If_CutData(pCut) == NULL );
    If_CutSetData( pCut, gFunc );
    // add this cut to the visited list
    Vec_PtrPush( vVisited, pCut );
    return gFunc;
}